

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O2

double __thiscall Lodtalk::Oop::decodeFloatOrInt(Oop *this)

{
  bool bVar1;
  SmallIntegerValue SVar2;
  double dVar3;
  
  bVar1 = isFloatOrInt(this);
  if (!bVar1) {
    __assert_fail("isFloatOrInt()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
  }
  if (((ulong)this->field_0 & 1) == 0) {
    dVar3 = decodeFloat(this);
    return dVar3;
  }
  SVar2 = decodeSmallInteger(this);
  return (double)SVar2;
}

Assistant:

inline double decodeFloatOrInt() const
    {
        assert(isFloatOrInt());
        if (isSmallInteger())
            return (double)decodeSmallInteger();
        return decodeFloat();
    }